

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QXdgDesktopPortalFileDialog::FilterCondition>::erase
          (QGenericArrayOps<QXdgDesktopPortalFileDialog::FilterCondition> *this,FilterCondition *b,
          qsizetype n)

{
  qsizetype *pqVar1;
  FilterCondition *pFVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  FilterCondition *pFVar7;
  
  pFVar7 = b + n;
  pFVar2 = (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).ptr;
  if ((pFVar2 == b) &&
     (pFVar7 != pFVar2 + (this->
                         super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).size
     )) {
    (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).ptr = pFVar7;
  }
  else {
    lVar3 = (this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).size;
    if (pFVar7 != pFVar2 + lVar3) {
      do {
        pFVar7 = b + n;
        b->type = pFVar7->type;
        pDVar4 = (b->pattern).d.d;
        (b->pattern).d.d = (pFVar7->pattern).d.d;
        (pFVar7->pattern).d.d = pDVar4;
        pcVar5 = (b->pattern).d.ptr;
        (b->pattern).d.ptr = (pFVar7->pattern).d.ptr;
        (pFVar7->pattern).d.ptr = pcVar5;
        qVar6 = (b->pattern).d.size;
        (b->pattern).d.size = (pFVar7->pattern).d.size;
        (pFVar7->pattern).d.size = qVar6;
        b = b + 1;
      } while (pFVar7 + 1 != pFVar2 + lVar3);
      pFVar7 = b + n;
    }
  }
  pqVar1 = &(this->super_QArrayDataPointer<QXdgDesktopPortalFileDialog::FilterCondition>).size;
  *pqVar1 = *pqVar1 - n;
  std::_Destroy_aux<false>::__destroy<QXdgDesktopPortalFileDialog::FilterCondition*>(b,pFVar7);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }